

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5VocabOpenMethod(sqlite3_vtab *pVTab,sqlite3_vtab_cursor **ppCsr)

{
  sqlite3_module *psVar1;
  int iVar2;
  char *pcVar3;
  sqlite3_int64 iCsrId;
  Fts5Cursor *pFVar4;
  sqlite3_vtab_cursor *psVar5;
  int iVar6;
  Fts5Table *pTab;
  sqlite3_vtab_cursor pStmt;
  long in_FS_OFFSET;
  sqlite3_vtab_cursor local_40;
  int rc;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  rc = 0;
  local_40.pVtab = (sqlite3_vtab *)0x0;
  if (*(int *)&pVTab[2].field_0xc != 0) {
    pcVar3 = sqlite3_mprintf("recursive definition for %s.%s",*(undefined8 *)&pVTab[1].nRef,
                             pVTab[1].pModule);
    pVTab->zErrMsg = pcVar3;
    iVar6 = 1;
    goto LAB_001d7451;
  }
  psVar1 = pVTab[1].pModule;
  pcVar3 = sqlite3Fts5Mprintf(&rc,"SELECT t.%Q FROM %Q.%Q AS t WHERE t.%Q MATCH \'*id\'",psVar1,
                              *(undefined8 *)&pVTab[1].nRef,psVar1,psVar1);
  if (pcVar3 != (char *)0x0) {
    rc = sqlite3_prepare_v2((sqlite3 *)pVTab[1].zErrMsg,pcVar3,-1,(sqlite3_stmt **)&local_40,
                            (char **)0x0);
  }
  iVar6 = rc;
  sqlite3_free(pcVar3);
  pStmt.pVtab = local_40.pVtab;
  if (iVar6 == 1) {
    rc = 0;
    iVar6 = 0;
  }
  *(undefined4 *)&pVTab[2].field_0xc = 1;
  if ((local_40.pVtab == (sqlite3_vtab *)0x0) ||
     (iVar2 = sqlite3_step((sqlite3_stmt *)local_40.pVtab), iVar2 != 100)) {
    pTab = (Fts5Table *)0x0;
  }
  else {
    pTab = (Fts5Table *)0x0;
    iCsrId = sqlite3_column_int64((sqlite3_stmt *)pStmt.pVtab,0);
    pFVar4 = fts5CursorFromCsrid((Fts5Global *)pVTab[2].pModule,iCsrId);
    if (pFVar4 != (Fts5Cursor *)0x0) {
      pTab = (Fts5Table *)(pFVar4->base).pVtab;
    }
  }
  *(undefined4 *)&pVTab[2].field_0xc = 0;
  if (iVar6 == 0) {
    if (pTab == (Fts5Table *)0x0) {
      rc = sqlite3_finalize((sqlite3_stmt *)pStmt.pVtab);
      if (rc == 0) {
        pStmt.pVtab = (sqlite3_vtab *)0x0;
        pcVar3 = sqlite3_mprintf("no such fts5 table: %s.%s",*(undefined8 *)&pVTab[1].nRef,
                                 pVTab[1].pModule);
        pVTab->zErrMsg = pcVar3;
        rc = 1;
      }
      else {
        pStmt.pVtab = (sqlite3_vtab *)0x0;
      }
      goto LAB_001d7440;
    }
    rc = sqlite3Fts5FlushToDisk(pTab);
    if ((rc != 0) ||
       (psVar5 = (sqlite3_vtab_cursor *)
                 sqlite3Fts5MallocZero(&rc,(long)pTab->pConfig->nCol * 0x10 + 0x80),
       psVar5 == (sqlite3_vtab_cursor *)0x0)) goto LAB_001d7440;
    psVar5[2].pVtab = &pTab->base;
    psVar5[1].pVtab = pStmt.pVtab;
    psVar5[9].pVtab = (sqlite3_vtab *)(psVar5 + 0x10);
    psVar5[10].pVtab = (sqlite3_vtab *)(psVar5 + (long)pTab->pConfig->nCol + 0x10);
  }
  else {
LAB_001d7440:
    sqlite3_finalize((sqlite3_stmt *)pStmt.pVtab);
    psVar5 = (sqlite3_vtab_cursor *)0x0;
  }
  *ppCsr = psVar5;
  iVar6 = rc;
LAB_001d7451:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return iVar6;
}

Assistant:

static int fts5VocabOpenMethod(
  sqlite3_vtab *pVTab,
  sqlite3_vtab_cursor **ppCsr
){
  Fts5VocabTable *pTab = (Fts5VocabTable*)pVTab;
  Fts5Table *pFts5 = 0;
  Fts5VocabCursor *pCsr = 0;
  int rc = SQLITE_OK;
  sqlite3_stmt *pStmt = 0;
  char *zSql = 0;

  if( pTab->bBusy ){
    pVTab->zErrMsg = sqlite3_mprintf(
       "recursive definition for %s.%s", pTab->zFts5Db, pTab->zFts5Tbl
    );
    return SQLITE_ERROR;
  }
  zSql = sqlite3Fts5Mprintf(&rc,
      "SELECT t.%Q FROM %Q.%Q AS t WHERE t.%Q MATCH '*id'",
      pTab->zFts5Tbl, pTab->zFts5Db, pTab->zFts5Tbl, pTab->zFts5Tbl
  );
  if( zSql ){
    rc = sqlite3_prepare_v2(pTab->db, zSql, -1, &pStmt, 0);
  }
  sqlite3_free(zSql);
  assert( rc==SQLITE_OK || pStmt==0 );
  if( rc==SQLITE_ERROR ) rc = SQLITE_OK;

  pTab->bBusy = 1;
  if( pStmt && sqlite3_step(pStmt)==SQLITE_ROW ){
    i64 iId = sqlite3_column_int64(pStmt, 0);
    pFts5 = sqlite3Fts5TableFromCsrid(pTab->pGlobal, iId);
  }
  pTab->bBusy = 0;

  if( rc==SQLITE_OK ){
    if( pFts5==0 ){
      rc = sqlite3_finalize(pStmt);
      pStmt = 0;
      if( rc==SQLITE_OK ){
        pVTab->zErrMsg = sqlite3_mprintf(
            "no such fts5 table: %s.%s", pTab->zFts5Db, pTab->zFts5Tbl
        );
        rc = SQLITE_ERROR;
      }
    }else{
      rc = sqlite3Fts5FlushToDisk(pFts5);
    }
  }

  if( rc==SQLITE_OK ){
    i64 nByte = pFts5->pConfig->nCol * sizeof(i64)*2 + sizeof(Fts5VocabCursor);
    pCsr = (Fts5VocabCursor*)sqlite3Fts5MallocZero(&rc, nByte);
  }

  if( pCsr ){
    pCsr->pFts5 = pFts5;
    pCsr->pStmt = pStmt;
    pCsr->aCnt = (i64*)&pCsr[1];
    pCsr->aDoc = &pCsr->aCnt[pFts5->pConfig->nCol];
  }else{
    sqlite3_finalize(pStmt);
  }

  *ppCsr = (sqlite3_vtab_cursor*)pCsr;
  return rc;
}